

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall sglr::rc::TextureCubeArray::updateView(TextureCubeArray *this,DepthStencilMode mode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ConstPixelBufferAccess *levels;
  int numLevels;
  int iVar5;
  TextureCubeArrayView local_28;
  
  uVar3 = (this->super_Texture).m_baseLevel;
  uVar4 = (ulong)uVar3;
  if ((uVar4 < 0xe) && ((this->m_levels).m_data[uVar4].m_cap != 0)) {
    uVar1 = (this->m_levels).m_access[uVar4].super_ConstPixelBufferAccess.m_size.m_data[0];
    uVar2 = (this->m_levels).m_access[uVar4].super_ConstPixelBufferAccess.m_size.m_data[1];
    if ((uVar2 != 0 && uVar1 != 0) &&
       ((this->m_levels).m_access[uVar4].super_ConstPixelBufferAccess.m_size.m_data[2] != 0)) {
      numLevels = 1;
      if (LINEAR < (this->super_Texture).m_sampler.minFilter) {
        iVar5 = ((this->super_Texture).m_maxLevel - uVar3) + 1;
        if ((int)uVar2 < (int)uVar1) {
          uVar2 = uVar1;
        }
        uVar3 = 0x20;
        if (uVar2 != 0) {
          uVar3 = 0x1f;
          if (uVar2 != 0) {
            for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          uVar3 = uVar3 ^ 0x1f;
        }
        numLevels = 0x20 - uVar3;
        if (iVar5 < (int)(0x20 - uVar3)) {
          numLevels = iVar5;
        }
      }
      TextureLevelArray::updateSamplerMode(&this->m_levels,mode);
      levels = (this->m_levels).m_effectiveAccess + uVar4;
      goto LAB_018d2d93;
    }
  }
  numLevels = 0;
  levels = (ConstPixelBufferAccess *)0x0;
LAB_018d2d93:
  tcu::TextureCubeArrayView::TextureCubeArrayView(&local_28,numLevels,levels);
  (this->m_view).m_numLevels = local_28.m_numLevels;
  *(undefined4 *)&(this->m_view).field_0x4 = local_28._4_4_;
  (this->m_view).m_levels = local_28.m_levels;
  return;
}

Assistant:

void TextureCubeArray::updateView (tcu::Sampler::DepthStencilMode mode)
{
	const int baseLevel	= getBaseLevel();

	if (hasLevel(baseLevel) && !isEmpty(getLevel(baseLevel)))
	{
		const int	width		= getLevel(baseLevel).getWidth();
		const int	height		= getLevel(baseLevel).getHeight();
		const bool	isMipmap	= isMipmapFilter(getSampler().minFilter);
		const int	numLevels	= isMipmap ? de::min(getMaxLevel()-baseLevel+1, getNumMipLevels2D(width, height)) : 1;

		m_levels.updateSamplerMode(mode);
		m_view = tcu::TextureCubeArrayView(numLevels, m_levels.getEffectiveLevels() + baseLevel);
	}
	else
		m_view = tcu::TextureCubeArrayView(0, DE_NULL);
}